

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

bool isAscii_helper(char16_t **ptr,char16_t *end)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  bool ok;
  char *end8;
  char *ptr8;
  quint32 in_stack_0000005c;
  char *in_stack_00000060;
  char **in_stack_00000068;
  bool local_11;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *in_RDI;
  bVar3 = simdTestMask(in_stack_00000068,in_stack_00000060,in_stack_0000005c);
  *in_RDI = lVar2;
  if (bVar3) {
    while (*in_RDI != in_RSI) {
      if ((*(ushort *)*in_RDI & 0xff80) != 0) {
        local_11 = false;
        goto LAB_001d0cfb;
      }
      *in_RDI = *in_RDI + 2;
    }
    local_11 = true;
  }
  else {
    local_11 = false;
  }
LAB_001d0cfb:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_11;
}

Assistant:

static bool isAscii_helper(const char16_t *&ptr, const char16_t *end)
{
#ifdef __SSE2__
    const char *ptr8 = reinterpret_cast<const char *>(ptr);
    const char *end8 = reinterpret_cast<const char *>(end);
    bool ok = simdTestMask(ptr8, end8, 0xff80ff80);
    ptr = reinterpret_cast<const char16_t *>(ptr8);
    if (!ok)
        return false;
#endif

    while (ptr != end) {
        if (*ptr & 0xff80)
            return false;
        ++ptr;
    }
    return true;
}